

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O2

void SHRotateXMinus(rot_data_t *c_in,rot_data_t *c_out,int lmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  SHRotateXPlus(c_in,c_out,lmax);
  iVar4 = 4;
  iVar1 = 2;
  iVar3 = 1;
  uVar5 = 1;
  while ((long)uVar5 <= (long)lmax) {
    fVar7 = *(float *)(&DAT_001889f8 + (ulong)((uVar5 & 1) == 0) * 4);
    iVar2 = (int)(uVar5 + 1) * (int)uVar5;
    c_out[iVar2] = c_out[iVar2] * fVar7;
    iVar2 = iVar3;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      c_out[(long)iVar1 + uVar6 + 1] = -fVar7 * c_out[(long)iVar1 + uVar6 + 1];
      c_out[iVar2] = fVar7 * c_out[iVar2];
      iVar2 = iVar2 + -1;
      fVar7 = -fVar7;
    }
    iVar1 = iVar1 + iVar4;
    iVar3 = iVar3 + iVar4;
    iVar4 = iVar4 + 2;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void SHRotateXMinus(const rot_data_t *c_in, rot_data_t *c_out, int lmax) {
    // -x rotations are the same as +x rotations, just with a negation
    // factor thrown in for some of the terms.
    SHRotateXPlus(c_in, c_out, lmax);

    // l = 0 band is a no op...
    for (int l = 1; l <= lmax; ++l) {
        float s = (l & 0x1) ? -1.f : 1.f;
        c_out[SHIndex(l, 0)] *= s;
        for (int m = 1; m <= l; ++m) {
            s = -s;
            c_out[SHIndex(l, m)] *= s;
            c_out[SHIndex(l, -m)] *= -s;
        }
    }
}